

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::visitBrOn(BinaryInstWriter *this,BrOn *curr)

{
  BrOnOp BVar1;
  Type right;
  ulong uVar2;
  ulong uVar3;
  WasmBinaryWriter *pWVar4;
  BufferWithRandomAccess *pBVar5;
  bool bVar6;
  Exactness EVar7;
  HeapType HVar8;
  size_t sVar9;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  LEB<unsigned_int,_unsigned_char> *pLVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  Name name;
  Name name_00;
  LEB<unsigned_int,_unsigned_char> local_34;
  
  BVar1 = curr->op;
  sVar9 = (size_t)(BVar1 - BrOnCast);
  if (BVar1 - BrOnCast < 2) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
               (uchar *)&local_34);
    LEB<unsigned_int,_unsigned_char>::write(&local_34,(int)this->o,__buf,sVar9);
    right.id = (curr->ref->type).id;
    if ((right.id < 7) || ((right.id & 1) != 0)) {
      __assert_fail("curr->ref->type.isRef()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                    ,0x8fd,"void wasm::BinaryInstWriter::visitBrOn(BrOn *)");
    }
    bVar6 = wasm::Type::isSubType((Type)(curr->castType).id,right);
    if (!bVar6) {
      __assert_fail("Type::isSubType(curr->castType, curr->ref->type)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                    ,0x8fe,"void wasm::BinaryInstWriter::visitBrOn(BrOn *)");
    }
    uVar2 = (curr->castType).id;
    uVar3 = (curr->ref->type).id;
    sVar9 = (size_t)(byte)((((uint)uVar2 & 3) == 2 && 6 < uVar2) * '\x02' |
                          (((uint)uVar3 & 3) == 2 && 6 < uVar3));
    pLVar10 = &local_34;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
               (uchar *)pLVar10);
    pBVar5 = this->o;
    name.super_IString.str._M_str = (curr->name).super_IString.str._M_str;
    name.super_IString.str._M_len = (size_t)pLVar10;
    getBreakIndex(this,name);
    LEB<unsigned_int,_unsigned_char>::write(&local_34,(int)pBVar5,__buf_00,sVar9);
    pWVar4 = this->parent;
    HVar8 = wasm::Type::getHeapType(&curr->ref->type);
    EVar7 = wasm::Type::getExactness(&curr->ref->type);
    WasmBinaryWriter::writeHeapType(pWVar4,HVar8,EVar7);
    pWVar4 = this->parent;
    HVar8 = wasm::Type::getHeapType(&curr->castType);
    EVar7 = wasm::Type::getExactness(&curr->castType);
    WasmBinaryWriter::writeHeapType(pWVar4,HVar8,EVar7);
  }
  else {
    if (BVar1 == BrOnNonNull) {
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
    }
    else {
      if (BVar1 != BrOnNull) {
        handle_unreachable("invalid br_on_*",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0x90a);
      }
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
    }
    pLVar10 = &local_34;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (this_00,(uchar *)pLVar10);
    pBVar5 = this->o;
    name_00.super_IString.str._M_str = (curr->name).super_IString.str._M_str;
    name_00.super_IString.str._M_len = (size_t)pLVar10;
    getBreakIndex(this,name_00);
    LEB<unsigned_int,_unsigned_char>::write(&local_34,(int)pBVar5,__buf_01,sVar9);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitBrOn(BrOn* curr) {
  switch (curr->op) {
    case BrOnNull:
      o << int8_t(BinaryConsts::BrOnNull);
      o << U32LEB(getBreakIndex(curr->name));
      return;
    case BrOnNonNull:
      o << int8_t(BinaryConsts::BrOnNonNull);
      o << U32LEB(getBreakIndex(curr->name));
      return;
    case BrOnCast:
    case BrOnCastFail: {
      o << int8_t(BinaryConsts::GCPrefix);
      if (curr->op == BrOnCast) {
        o << U32LEB(BinaryConsts::BrOnCast);
      } else {
        o << U32LEB(BinaryConsts::BrOnCastFail);
      }
      assert(curr->ref->type.isRef());
      assert(Type::isSubType(curr->castType, curr->ref->type));
      uint8_t flags = (curr->ref->type.isNullable() ? 1 : 0) |
                      (curr->castType.isNullable() ? 2 : 0);
      o << flags;
      o << U32LEB(getBreakIndex(curr->name));
      parent.writeHeapType(curr->ref->type.getHeapType(),
                           curr->ref->type.getExactness());
      parent.writeHeapType(curr->castType.getHeapType(),
                           curr->castType.getExactness());
      return;
    }
  }
  WASM_UNREACHABLE("invalid br_on_*");
}